

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

string * cs::process_path(string *__return_storage_ptr__,string *raw)

{
  long lVar1;
  long lVar2;
  fatal_error *this;
  allocator local_41;
  string local_40;
  
  lVar1 = std::__cxx11::string::find((char)raw,0x22);
  lVar2 = std::__cxx11::string::rfind((char)raw,0x22);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)raw);
  }
  else {
    if (lVar1 == lVar2) {
      this = (fatal_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"argument syntax error.",&local_41);
      fatal_error::fatal_error(this,&local_40);
      __cxa_throw(this,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)raw);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string process_path(const std::string &raw)
	{
		auto pos0 = raw.find('\"');
		auto pos1 = raw.rfind('\"');
		if (pos0 != std::string::npos) {
			if (pos0 == pos1)
				throw cs::fatal_error("argument syntax error.");
			else
				return raw.substr(pos0 + 1, pos1 - pos0 - 1);
		}
		else
			return raw;
	}